

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus decodeBDAddr12Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  uint local_3c;
  uint64_t Disp;
  uint64_t Base;
  uint *Regs_local;
  uint64_t Field_local;
  MCInst *Inst_local;
  
  if (Field >> 0xc == 0) {
    local_3c = 0;
  }
  else {
    local_3c = Regs[Field >> 0xc];
  }
  MCOperand_CreateReg0(Inst,local_3c);
  MCOperand_CreateImm0(Inst,Field & 0xfff);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeBDAddr12Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Base = Field >> 12;
	uint64_t Disp = Field & 0xfff;
	//assert(Base < 16 && "Invalid BDAddr12");

	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, Disp);

	return MCDisassembler_Success;
}